

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O2

int __thiscall
CVmObjHTTPRequest::common_sendReply
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc,int wait)

{
  OS_Counter *pOVar1;
  char cVar2;
  utf8_ptr uVar3;
  int32_t iVar4;
  err_frame_t *peVar5;
  CVmException *pCVar6;
  int iVar7;
  wchar_t wVar8;
  bodyArg *this_00;
  undefined8 *puVar9;
  long *plVar10;
  int *__s1;
  ushort *puVar11;
  size_t sVar12;
  ushort *cont_type_len;
  char *status;
  HTTPReplySender *this_01;
  ssize_t sVar13;
  void *__buf;
  char *pcVar14;
  long lVar15;
  uint argc;
  vm_val_t *this_02;
  size_t status_len;
  utf8_ptr p;
  size_t rem;
  int local_358;
  int32_t len;
  CVmObjHTTPRequest *local_350;
  vm_obj_id_t local_344;
  vm_val_t *local_340;
  utf8_ptr local_338;
  TadsHttpRequest *local_330;
  utf8_ptr srcp;
  int32_t ofs;
  err_frame_t err_cur__;
  char buf [512];
  
  if (oargc == (uint *)0x0) {
    argc = 0;
  }
  else {
    argc = *oargc;
  }
  if ((common_sendReply(unsigned_int,vm_val_t*,unsigned_int*,int)::desc == '\0') &&
     (iVar7 = __cxa_guard_acquire(&common_sendReply(unsigned_int,vm_val_t*,unsigned_int*,int)::desc)
     , iVar7 != 0)) {
    common_sendReply::desc.min_argc_ = 1;
    common_sendReply::desc.opt_argc_ = 3;
    common_sendReply::desc.varargs_ = 0;
    __cxa_guard_release(&common_sendReply(unsigned_int,vm_val_t*,unsigned_int*,int)::desc);
  }
  iVar7 = CVmObject::get_prop_check_argc(retval,oargc,&common_sendReply::desc);
  if (iVar7 != 0) {
    return 1;
  }
  local_330 = *(TadsHttpRequest **)(this->super_CVmObject).ext_;
  if ((local_330->super_TadsEventMessage).super_TadsMessage.completed != 0) {
    throw_net_err("request already completed",0);
  }
  this_00 = (bodyArg *)operator_new(0x58);
  bodyArg::bodyArg(this_00,0);
  puVar9 = (undefined8 *)_ZTW11G_err_frame();
  err_cur__.prv_ = (err_frame_t *)*puVar9;
  plVar10 = (long *)_ZTW11G_err_frame();
  *plVar10 = (long)&err_cur__;
  err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
  if (err_cur__.state_ != 0) {
    this_01 = (HTTPReplySender *)0x0;
    goto LAB_00206d33;
  }
  if (this_00->init_err != 0) {
    err_throw(this_00->init_err);
  }
  local_358 = wait;
  local_344 = self;
  local_340 = retval;
  if (this_00->status_code == 0) {
    pcVar14 = (char *)0x0;
    cont_type_len = (ushort *)pcVar14;
    if (this_00->none == 0) {
      if ((argc < 2) || (sp_[-2].typ == VM_NIL)) {
        ofs = 0;
        len = 0x200;
        __s1 = (int *)bodyArg::extract(this_00,buf,&ofs,&len);
        iVar7 = bodyArg::is_text(this_00);
        iVar4 = len;
        if (iVar7 == 0) {
          if (len < 0xb) {
            if (6 < len) goto LAB_00206a63;
            if (len < 4) goto LAB_00206ec4;
LAB_00206e0c:
            iVar7 = bcmp(__s1,"ID3",3);
            if (iVar7 == 0) {
              pcVar14 = "audio/mpeg";
            }
            else {
              if ((uint)iVar4 < 0xf) {
                if ((uint)iVar4 < 5) goto LAB_00206ec4;
              }
              else {
                iVar7 = bcmp(__s1,"OggS",0xe);
                if (iVar7 == 0) {
                  pcVar14 = "application/ogg";
                  goto LAB_00206c18;
                }
              }
              if (*__s1 == 0x4468544d) {
                pcVar14 = "audio/midi";
              }
              else {
                if (8 < (uint)iVar4) {
                  iVar7 = bcmp(__s1,"FWS",3);
                  pcVar14 = "application/x-shockwave-flash";
                  if ((iVar7 == 0) || (iVar7 = bcmp(__s1,"CWS",3), iVar7 == 0)) goto LAB_00206c18;
                }
LAB_00206ec4:
                pcVar14 = "application/octet-stream";
              }
            }
          }
          else if ((((char)*__s1 == -1) && (*(char *)((long)__s1 + 1) == -0x28)) &&
                  (*(int *)((long)__s1 + 6) == 0x4649464a)) {
            pcVar14 = "image/jpeg";
          }
          else {
LAB_00206a63:
            iVar7 = bcmp(__s1,"GIF87a",6);
            pcVar14 = "image/gif";
            if ((iVar7 != 0) && (iVar7 = bcmp(__s1,"GIF89a",6), iVar7 != 0)) {
              iVar7 = bcmp(__s1,anon_var_dwarf_72499,6);
              if (iVar7 != 0) goto LAB_00206e0c;
              pcVar14 = "image/png";
            }
          }
        }
        else {
          rem = (size_t)len;
          p.p_ = (char *)__s1;
          local_350 = this;
          while (rem != 0) {
            if ((rem < 4) || (*(int *)p.p_ != 0x2d2d213c)) {
              wVar8 = utf8_ptr::s_getch(p.p_);
              iVar7 = t3_is_whitespace(wVar8);
              if (iVar7 == 0) {
                sVar12 = rem;
                if ((rem < 6) || (iVar7 = memicmp(p.p_,"<html",5), sVar12 = rem, iVar7 != 0))
                goto LAB_00206ac7;
                pcVar14 = "text/html";
                this = local_350;
                goto LAB_00206c18;
              }
LAB_0020695c:
              utf8_ptr::inc(&p,&rem);
            }
            else {
              while (rem != 0) {
                if ((2 < rem) && (iVar7 = bcmp(p.p_,"-->",3), iVar7 == 0)) {
                  utf8_ptr::inc(&p,&rem);
                  utf8_ptr::inc(&p,&rem);
                  goto LAB_0020695c;
                }
                utf8_ptr::inc(&p,&rem);
              }
            }
          }
          sVar12 = 0;
LAB_00206ac7:
          uVar3.p_ = p.p_;
          status_len = sVar12;
          srcp.p_ = p.p_;
          while (status_len != 0) {
            wVar8 = utf8_ptr::s_getch(srcp.p_);
            iVar7 = is_space(wVar8);
            if (iVar7 == 0) break;
            utf8_ptr::inc(&srcp,&status_len);
          }
          lVar15 = 0;
          local_338.p_ = uVar3.p_;
          while (status_len != 0) {
            if (lVar15 == 0xf) {
              pcVar14 = "";
              goto LAB_00206bd0;
            }
            cVar2 = "<!doctype html "[lVar15];
            wVar8 = utf8_ptr::s_getch(local_338.p_);
            wVar8 = to_lower(wVar8);
            if ((cVar2 == ' ') && (iVar7 = is_space(wVar8), iVar7 != 0)) {
              do {
                utf8_ptr::inc(&local_338,&status_len);
                if (status_len == 0) break;
                wVar8 = utf8_ptr::s_getch(local_338.p_);
                iVar7 = is_space(wVar8);
              } while (iVar7 != 0);
            }
            else {
              if (wVar8 != cVar2) goto LAB_00206bed;
              utf8_ptr::inc(&local_338,&status_len);
            }
            lVar15 = lVar15 + 1;
          }
          pcVar14 = "<!doctype html " + lVar15;
LAB_00206bd0:
          if (*pcVar14 == '\0') {
            pcVar14 = "text/html";
            this = local_350;
          }
          else {
LAB_00206bed:
            this = local_350;
            if ((rem < 6) || (iVar7 = memicmp(p.p_,"<?xml",5), iVar7 != 0)) {
              pcVar14 = "text/plain";
            }
            else {
              pcVar14 = "text/xml";
            }
          }
        }
LAB_00206c18:
        cont_type_len = (ushort *)strlen(pcVar14);
      }
      else {
        puVar11 = (ushort *)vm_val_t::get_as_string(sp_ + -2);
        if (puVar11 == (ushort *)0x0) {
          err_throw(0x7e3);
        }
        cont_type_len = (ushort *)(ulong)*puVar11;
        pcVar14 = (char *)(puVar11 + 1);
      }
    }
  }
  else {
    pcVar14 = "text/html";
    cont_type_len = (ushort *)0x9;
  }
  status = get_status_arg(this_00->status_code,2,argc,&status_len);
  if ((argc < 4) || (sp_[-4].typ == VM_NIL)) {
    this_02 = (vm_val_t *)0x0;
  }
  else {
    this_02 = sp_ + -4;
    iVar7 = vm_val_t::is_listlike(this_02);
    if (iVar7 == 0) {
      err_throw(0x7e4);
    }
  }
  this_01 = (HTTPReplySender *)operator_new(0x78);
  (this_01->super_CVmRefCntObj).cnt.cnt.super___atomic_base<long>._M_i = 1;
  (this_01->super_CVmRefCntObj)._vptr_CVmRefCntObj = (_func_int **)&PTR__HTTPReplySender_00343bc0;
  this_01->reqid = 0;
  this_01->vmg = (vm_globals *)0x0;
  this_01->queue = (TadsMessageQueue *)0x0;
  this_01->reqvar = (vm_globalvar_t *)0x0;
  this_01->req = (TadsHttpRequest *)0x0;
  this_01->status = (char *)0x0;
  this_01->status_len = 0;
  this_01->headers = (http_header *)0x0;
  this_01->body = (bodyArg *)0x0;
  this_01->cont_type = (char *)0x0;
  this_01->cont_type_len = 0;
  *(undefined8 *)((long)&this_01->cont_type_len + 4) = 0;
  *(undefined8 *)((long)&this_01->cookies + 4) = 0;
  sVar12 = status_len;
  HTTPReplySender::set_params
            (this_01,local_344,local_330,status,status_len,this_02,this_00,pcVar14,
             (size_t)cont_type_len,*(vm_httpreq_cookie **)((this->super_CVmObject).ext_ + 8));
  if (local_358 == 0) {
    HTTPReplySender::start_thread(this_01);
    retval = local_340;
  }
  else {
    sVar13 = HTTPReplySender::send(this_01,(int)buf,__buf,(size_t)status,(int)sVar12);
    retval = local_340;
    if ((int)sVar13 == 0) {
      throw_net_err((char *)buf._8_8_,buf._0_4_);
    }
  }
  this_00 = (bodyArg *)0x0;
LAB_00206d33:
  if (-1 < (short)err_cur__.state_) {
    err_cur__.state_ = err_cur__.state_ | 0x8000;
    if (this_00 != (bodyArg *)0x0) {
      bodyArg::~bodyArg(this_00);
      operator_delete(this_00,0x58);
    }
    if (this_01 != (HTTPReplySender *)0x0) {
      LOCK();
      pOVar1 = &(this_01->super_CVmRefCntObj).cnt;
      (pOVar1->cnt).super___atomic_base<long>._M_i =
           (pOVar1->cnt).super___atomic_base<long>._M_i + -1;
      UNLOCK();
      if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
        (*(this_01->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])(this_01);
      }
    }
  }
  peVar5 = err_cur__.prv_;
  puVar9 = (undefined8 *)_ZTW11G_err_frame();
  *puVar9 = peVar5;
  if ((err_cur__.state_ & 0x4001U) != 0) {
    puVar9 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(byte *)*puVar9 & 2) != 0) {
      plVar10 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar10 + 0x10));
    }
    pCVar6 = err_cur__.exc_;
    plVar10 = (long *)_ZTW11G_err_frame();
    *(CVmException **)(*plVar10 + 0x10) = pCVar6;
    err_rethrow();
  }
  if ((err_cur__.state_ & 2U) != 0) {
    free(err_cur__.exc_);
  }
  sp_ = sp_ + -(long)(int)argc;
  retval->typ = VM_NIL;
  return 1;
}

Assistant:

int CVmObjHTTPRequest::common_sendReply(
    VMG_ vm_obj_id_t self, vm_val_t *retval, uint *oargc, int wait)
{
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1, 3);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the request */
    TadsHttpRequest *req = get_ext()->req;

    /* if the request is already completed, this is an error */
    if (req->completed)
        throw_net_err(vmg_ "request already completed", 0);

    /* get the 'body' argument (leave it on the stack for gc protection) */
    bodyArg *body = new bodyArg(vmg_ 0);

    /* no reply sender yet */
    HTTPReplySender *sender = 0;

    err_try
    {
        /* get the content type, if present */
        const char *cont_type = 0;
        size_t cont_type_len = 0;
        if (body->init_err != 0)
        {
            err_throw(body->init_err);
        }
        else if (body->status_code != 0)
        {
            /* we're using a generated HTML reply, so it's always text/html */
            cont_type = "text/html";
            cont_type_len = 9;
        }
        else if (body->none)
        {
            /* no body -> no content type */
            cont_type = 0;
            cont_type_len = 0;
        }
        else if (argc >= 2 && G_stk->get(1)->typ != VM_NIL)
        {
            /* retrieve the content type - this must be a string */
            cont_type = G_stk->get(1)->get_as_string(vmg0_);
            if (cont_type == 0)
                err_throw(VMERR_STRING_VAL_REQD);

            /* get the length and buffer pointer */
            cont_type_len = vmb_get_len(cont_type);
            cont_type += VMB_LEN;
        }
        else
        {
            /* 
             *   There's no content type argument, so we need to infer the
             *   type from the 'body' argument.  First, extract the initial
             *   section of the content to check for common signatures.  
             */
            char buf[512];
            int32_t ofs = 0, len = sizeof(buf);
            const char *bufp = body->extract(buf, ofs, len);

            /* check to see if the body is text or binary */
            if (body->is_text(vmg0_))
            {
                /* 
                 *   it's text data, so check for tell-tale signs of HTML and
                 *   XML, after skipping leading whitespace and HTML-style
                 *   comments 
                 */
                utf8_ptr p((char *)bufp);
                size_t rem = (size_t)len;
                while (rem != 0)
                {
                    /* if we're at a comment starter, skip the comment */
                    if (rem >= 4 && memcmp(p.getptr(), "<!--", 4) == 0)
                    {
                        /* skip to the closing sequence */
                        for ( ; rem != 0 ; p.inc(&rem))
                        {
                            if (rem >= 3 && memcmp(p.getptr(), "-->", 3) == 0)
                            {
                                /* skip it and stop looking */
                                p.inc(&rem);
                                p.inc(&rem);
                                p.inc(&rem);
                                break;
                            }
                        }

                        /* continue scanning */
                        continue;
                    }

                    /* if we're at any whitespace character, just skip it */
                    if (t3_is_whitespace(p.getch()))
                    {
                        p.inc(&rem);
                        continue;
                    }

                    /* otherwise stop scanning */
                    break;
                }

                /* check for <HTML or <?XML prefixes */
                if ((rem > 5 && memicmp(p.getptr(), "<html", 5) == 0)
                    || eq_skip_sp(p.getptr(), rem, "<!doctype html "))
                {
                    /* it looks like HTML */
                    cont_type = "text/html";
                }
                else if (rem > 5 && memicmp(p.getptr(), "<?xml", 5) == 0)
                {
                    /* it looks like XML */
                    cont_type = "text/xml";
                }
                else
                {
                    /* it doesn't look like HTML or XML, so use plain text */
                    cont_type = "text/plain";
                }
            }
            else
            {
                /* 
                 *   Treat it as binary data.  Check the first few bytes to
                 *   see if the file signature matches a known media type.  
                 */
                if (len > 10
                    && (unsigned char)bufp[0] == 0xff
                    && (unsigned char)bufp[1] == 0xd8
                    && memcmp(bufp+6, "JFIF", 4) == 0)
                {
                    /* it's a JPEG image */
                    cont_type = "image/jpeg";
                }
                else if (len > 6
                         && (memcmp(bufp, "GIF87a", 6) == 0
                             || memcmp(bufp, "GIF89a", 6) == 0))
                {
                    /* it's a GIF image */
                    cont_type = "image/gif";
                }
                else if (len > 6 && memcmp(bufp, "\211PNG\r\n\032\n", 6) == 0)
                {
                    /* it's a PNG image */
                    cont_type = "image/png";
                }
                else if (len > 3 && memcmp(bufp, "ID3", 3) == 0)
                {
                    /* MP3 file */
                    cont_type = "audio/mpeg";
                }
                else if (len > 14 && memcmp(
                    bufp, "OggS\000\002\000\000\000\000\000\000\000\000", 14)
                         == 0)
                {
                    /* Ogg Vorbis audio */
                    cont_type = "application/ogg";
                }
                else if (len > 4 && memcmp(bufp, "MThD", 4) == 0)
                {
                    /* MIDI */
                    cont_type = "audio/midi";
                }
                else if (len > 8
                         && (memcmp(bufp, "FWS", 3) == 0
                             || memcmp(bufp, "CWS", 3) == 0))
                {
                    /* shockwave flash */
                    cont_type = "application/x-shockwave-flash";
                }
                else
                {
                    /* we don't recognize it; use generic binary */
                    cont_type = "application/octet-stream";
                }
            }

            /* get the length of the content type string we selected */
            cont_type_len = strlen(cont_type);
        }

        /* get the result code, if present */
        size_t status_len;
        const char *status = get_status_arg(vmg_ body->status_code,
                                            2, argc, status_len);

        /* get the headers argument */
        vm_val_t *headers = 0;
        if (argc >= 4 && G_stk->get(3)->typ != VM_NIL)
        {
            /* get the headers value */
            headers = G_stk->get(3);

            /* make sure it's a list */
            if (!headers->is_listlike(vmg0_))
                err_throw(VMERR_LIST_VAL_REQD);
        }

        /* set up a reply sender object */
        sender = new HTTPReplySender();
        sender->set_params(
            vmg_ self, req, status, status_len, headers, body,
            cont_type, cont_type_len, get_ext()->cookies);

        /* the sender now owns our 'body' object */
        body = 0;

        /* send the reply, either directly or in a new thread */
        if (wait)
        {
            /* waiting for completion - send in the current thread */
            http_reply_err err;
            if (!sender->send(&err))
                throw_net_err(vmg_ err.msg, err.sock_err);
        }
        else
        {
            /* sending asynchronously - send in a new thread */
            sender->start_thread(vmg0_);
        }
    }